

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QString,_QtInstallDirectoryWithTriple> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::findNode<QString>
          (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *this,QString *key)

{
  ulong uVar1;
  Node<QString,_QtInstallDirectoryWithTriple> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QString>(this,key);
  uVar1 = (ulong)(BVar3.span)->offsets[BVar3.index];
  if (uVar1 == 0xff) {
    pNVar2 = (Node<QString,_QtInstallDirectoryWithTriple> *)0x0;
  }
  else {
    pNVar2 = (Node<QString,_QtInstallDirectoryWithTriple> *)((BVar3.span)->entries + uVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }